

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

char * fgets3(FILE *file,char *line,int nbChar)

{
  bool bVar1;
  FILE *local_30;
  char *r;
  int nbChar_local;
  char *line_local;
  FILE *file_local;
  
  if (nbChar < 2) {
    file_local = (FILE *)0x0;
  }
  else {
    do {
      local_30 = (FILE *)fgets(line,nbChar,(FILE *)file);
      if (((*line == '%') || (*line == '#')) ||
         ((bVar1 = false, *line == '/' && (bVar1 = false, line[1] == '/')))) {
        bVar1 = local_30 != (FILE *)0x0;
      }
    } while (bVar1);
    if (*line == '$') {
      local_30 = (FILE *)0x0;
    }
    file_local = local_30;
  }
  return (char *)file_local;
}

Assistant:

inline char* fgets3(FILE* file, char* line, int nbChar)
{ 
	char* r = NULL;

	if (nbChar < 2)
	{
		return NULL;
	}

	do   
	{
		r = fgets(line, nbChar, file);
	} 
	while ((
		(line[0] == '%')||
		(line[0] == '#')||
		((line[0] == '/')&&(line[1] == '/'))
		) && (r != NULL));

	if (line[0] == '$')
	{
		r = NULL;
	}

	return r;
}